

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall arangodb::velocypack::Parser::parseJson(Parser *this)

{
  byte bVar1;
  ulong uVar2;
  
  skipWhiteSpace(this,"Expecting item");
  uVar2 = this->_pos;
  if (this->_size <= uVar2) {
    return;
  }
  this->_pos = uVar2 + 1;
  bVar1 = this->_start[uVar2];
  if (bVar1 < 0x6e) {
    if (bVar1 == 0x22) {
      parseString(this);
      return;
    }
    if (bVar1 == 0x5b) {
      parseArray(this);
      return;
    }
    if (bVar1 == 0x66) {
      parseFalse(this);
      return;
    }
  }
  else {
    if (bVar1 == 0x6e) {
      parseNull(this);
      return;
    }
    if (bVar1 == 0x74) {
      parseTrue(this);
      return;
    }
    if (bVar1 == 0x7b) {
      parseObject(this);
      return;
    }
  }
  this->_pos = uVar2;
  parseNumber(this);
  return;
}

Assistant:

void Parser::parseJson() {
  skipWhiteSpace("Expecting item");  // return value intentionally not checked

  int i = consume();
  if (i < 0) {
    return;
  }
  switch (i) {
    case '{':
      parseObject();  // this consumes the closing '}' or throws
      break;
    case '[':
      parseArray();  // this consumes the closing ']' or throws
      break;
    case 't':
      parseTrue();  // this consumes "rue" or throws
      break;
    case 'f':
      parseFalse();  // this consumes "alse" or throws
      break;
    case 'n':
      parseNull();  // this consumes "ull" or throws
      break;
    case '"':
      parseString();
      break;
    default: {
      // everything else must be a number or is invalid...
      // this includes '-' and '0' to '9'. scanNumber() will
      // throw if the input is non-numeric
      unconsume();
      parseNumber();  // this consumes the number or throws
      break;
    }
  }
}